

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

Vec_Ptr_t * Prs_CreateDetectRams(Prs_Ntk_t *pNtk)

{
  int NameRamId_00;
  int iVar1;
  char *__s1;
  char *Entry;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  void *Entry_00;
  Vec_Int_t *pVVar4;
  bool bVar5;
  int local_4c;
  int fWrite;
  int k;
  int i;
  int NameRamId;
  char *pRamName;
  char *pNtkName;
  Vec_Int_t *vBoxCopy;
  Vec_Int_t *vBox;
  Vec_Ptr_t *vRam;
  Vec_Ptr_t *vAllRams;
  Prs_Ntk_t *pNtk_local;
  
  vRam = (Vec_Ptr_t *)0x0;
  NameRamId_00 = Abc_NamStrFind(pNtk->pStrs,"Ram");
  fWrite = 0;
  do {
    iVar1 = Prs_NtkBoxNum(pNtk);
    bVar5 = false;
    if (fWrite < iVar1) {
      vBoxCopy = Prs_BoxSignals(pNtk,fWrite);
      bVar5 = vBoxCopy != (Vec_Int_t *)0x0;
    }
    if (!bVar5) {
      return vRam;
    }
    iVar1 = Prs_BoxIsNode(pNtk,fWrite);
    if (iVar1 == 0) {
      iVar1 = Prs_BoxNtk(pNtk,fWrite);
      __s1 = Prs_NtkStr(pNtk,iVar1);
      iVar1 = strncmp(__s1,"ClockedWritePort_",0x11);
      bVar5 = iVar1 == 0;
      if ((bVar5) || (iVar1 = strncmp(__s1,"ReadPort_",9), iVar1 == 0)) {
        Entry = Prs_CreateDetectRamPort(pNtk,vBoxCopy,NameRamId_00);
        if (Entry == (char *)0x0) {
          __assert_fail("pRamName",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                        ,0x6d6,"Vec_Ptr_t *Prs_CreateDetectRams(Prs_Ntk_t *)");
        }
        if (vRam == (Vec_Ptr_t *)0x0) {
          vRam = Vec_PtrAlloc(4);
        }
        for (local_4c = 0; iVar1 = Vec_PtrSize(vRam), local_4c < iVar1; local_4c = local_4c + 1) {
          pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vRam,local_4c);
          pcVar3 = (char *)Vec_PtrEntry(pVVar2,0);
          if (Entry == pcVar3) {
            if (bVar5) {
              pVVar4 = Vec_IntDup(vBoxCopy);
              Vec_IntPush(pVVar4,fWrite);
              Vec_PtrPush(pVVar2,pVVar4);
            }
            break;
          }
        }
        iVar1 = Vec_PtrSize(vRam);
        if (iVar1 <= local_4c) {
          pVVar2 = Vec_PtrAlloc(4);
          Vec_PtrPush(pVVar2,Entry);
          iVar1 = Prs_CreateGetMemSize(__s1);
          Entry_00 = Abc_Int2Ptr(iVar1);
          Vec_PtrPush(pVVar2,Entry_00);
          if (bVar5) {
            pVVar4 = Vec_IntDup(vBoxCopy);
            Vec_IntPush(pVVar4,fWrite);
            Vec_PtrPush(pVVar2,pVVar4);
          }
          Vec_PtrPush(vRam,pVVar2);
        }
      }
    }
    fWrite = fWrite + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Prs_CreateDetectRams( Prs_Ntk_t * pNtk )
{
    Vec_Ptr_t * vAllRams = NULL, * vRam; 
    Vec_Int_t * vBox, * vBoxCopy; 
    char * pNtkName, * pRamName;
    int NameRamId = Abc_NamStrFind( pNtk->pStrs, "Ram" );
    int i, k, fWrite;
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
            continue;
        pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
        fWrite = !strncmp(pNtkName, "ClockedWritePort_", strlen("ClockedWritePort_"));
        if ( fWrite || !strncmp(pNtkName, "ReadPort_", strlen("ReadPort_")) )
        {
            pRamName = Prs_CreateDetectRamPort( pNtk, vBox, NameRamId ); assert( pRamName );
            if ( vAllRams == NULL )
                vAllRams = Vec_PtrAlloc( 4 );
            Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, k )
                if ( pRamName == (char *)Vec_PtrEntry(vRam, 0) )
                {
                    if ( fWrite )
                    {
                        vBoxCopy = Vec_IntDup(vBox);
                        Vec_IntPush( vBoxCopy, i );
                        Vec_PtrPush( vRam, vBoxCopy );
                    }
                    break;
                }
            if ( k < Vec_PtrSize(vAllRams) )
                continue;
            vRam = Vec_PtrAlloc( 4 );
            Vec_PtrPush( vRam, pRamName );
            Vec_PtrPush( vRam, Abc_Int2Ptr(Prs_CreateGetMemSize(pNtkName)) );
            if ( fWrite )
            {
                vBoxCopy = Vec_IntDup(vBox);
                Vec_IntPush( vBoxCopy, i );
                Vec_PtrPush( vRam, vBoxCopy );
            }
            Vec_PtrPush( vAllRams, vRam );
        }
    }
    return vAllRams;
}